

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroupDictionary.cpp
# Opt level: O3

void __thiscall
BamTools::SamReadGroupDictionary::Add(SamReadGroupDictionary *this,SamReadGroup *readGroup)

{
  pointer pSVar1;
  pointer pSVar2;
  const_iterator cVar3;
  mapped_type_conflict *pmVar4;
  
  if (((this->m_data).
       super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_data).
       super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&(this->m_lookupData)._M_t,&readGroup->ID),
     (_Rb_tree_header *)cVar3._M_node != &(this->m_lookupData)._M_t._M_impl.super__Rb_tree_header))
  {
    return;
  }
  std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>::push_back
            (&this->m_data,readGroup);
  pSVar1 = (this->m_data).
           super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = (this->m_data).
           super__Vector_base<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->m_lookupData,&readGroup->ID);
  *pmVar4 = ((long)pSVar1 - (long)pSVar2 >> 3) * -0x505050505050505 - 1;
  return;
}

Assistant:

void SamReadGroupDictionary::Add(const SamReadGroup& readGroup)
{
    if (IsEmpty() || !Contains(readGroup)) {
        m_data.push_back(readGroup);
        m_lookupData[readGroup.ID] = m_data.size() - 1;
    }
}